

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quantile_state.hpp
# Opt level: O0

CursorType * __thiscall
duckdb::QuantileState<signed_char,_duckdb::QuantileStandardType>::GetOrCreateWindowCursor
          (QuantileState<signed_char,_duckdb::QuantileStandardType> *this,
          WindowPartitionInput *partition)

{
  bool bVar1;
  type pQVar2;
  WindowPartitionInput *in_RDI;
  unique_ptr<duckdb::QuantileCursor<signed_char>,_std::default_delete<duckdb::QuantileCursor<signed_char>_>,_true>
  *in_stack_ffffffffffffffd8;
  WindowPartitionInput *args;
  
  args = in_RDI;
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<duckdb::QuantileCursor<signed_char>,_std::default_delete<duckdb::QuantileCursor<signed_char>_>_>
                      *)0x9fbf01);
  if (!bVar1) {
    make_uniq<duckdb::QuantileCursor<signed_char>,duckdb::WindowPartitionInput_const&>(args);
    unique_ptr<duckdb::QuantileCursor<signed_char>,_std::default_delete<duckdb::QuantileCursor<signed_char>_>,_true>
    ::operator=((unique_ptr<duckdb::QuantileCursor<signed_char>,_std::default_delete<duckdb::QuantileCursor<signed_char>_>,_true>
                 *)in_RDI,in_stack_ffffffffffffffd8);
    unique_ptr<duckdb::QuantileCursor<signed_char>,_std::default_delete<duckdb::QuantileCursor<signed_char>_>,_true>
    ::~unique_ptr((unique_ptr<duckdb::QuantileCursor<signed_char>,_std::default_delete<duckdb::QuantileCursor<signed_char>_>,_true>
                   *)0x9fbf31);
  }
  pQVar2 = unique_ptr<duckdb::QuantileCursor<signed_char>,_std::default_delete<duckdb::QuantileCursor<signed_char>_>,_true>
           ::operator*((unique_ptr<duckdb::QuantileCursor<signed_char>,_std::default_delete<duckdb::QuantileCursor<signed_char>_>,_true>
                        *)in_RDI);
  return pQVar2;
}

Assistant:

CursorType &GetOrCreateWindowCursor(const WindowPartitionInput &partition) {
		if (!window_cursor) {
			window_cursor = make_uniq<CursorType>(partition);
		}
		return *window_cursor;
	}